

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O2

SENode * __thiscall spvtools::opt::SENodeSimplifyImpl::SimplifyPolynomial(SENodeSimplifyImpl *this)

{
  ScalarEvolutionAnalysis *pSVar1;
  _Base_ptr coefficient_update;
  pointer ppSVar2;
  int iVar3;
  SENode *in_RAX;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> new_node;
  SENode *operand_1;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  SENode *pSVar5;
  _func_int **pp_Var6;
  long lVar7;
  pointer *__ptr;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  new_node._M_head_impl = (SENode *)operator_new(0x30);
  pSVar5 = this->node_;
  pSVar1 = pSVar5->parent_analysis_;
  ((new_node._M_head_impl)->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((new_node._M_head_impl)->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((new_node._M_head_impl)->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (new_node._M_head_impl)->parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  (new_node._M_head_impl)->unique_id_ = SENode::NumberOfNodes;
  (new_node._M_head_impl)->_vptr_SENode = (_func_int **)&PTR_GetType_003b60c0;
  GatherAccumulatorsFromChildNodes(this,new_node._M_head_impl,pSVar5,false);
  if (this->constant_accumulator_ != 0) {
    ScalarEvolutionAnalysis::CreateConstant(this->analysis_,this->constant_accumulator_);
    (*(new_node._M_head_impl)->_vptr_SENode[3])(new_node._M_head_impl);
  }
  for (p_Var4 = (this->accumulators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->accumulators_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pSVar5 = *(SENode **)(p_Var4 + 1);
    coefficient_update = p_Var4[1]._M_parent;
    if (coefficient_update == (_Base_ptr)0x1) {
LAB_0022c18a:
      (*(new_node._M_head_impl)->_vptr_SENode[3])(new_node._M_head_impl);
    }
    else if (coefficient_update != (_Base_ptr)0x0) {
      if ((coefficient_update == (_Base_ptr)0xffffffffffffffff) &&
         (iVar3 = (**pSVar5->_vptr_SENode)(pSVar5), iVar3 != 1)) {
        ScalarEvolutionAnalysis::CreateNegation(this->analysis_,pSVar5);
      }
      else {
        iVar3 = (**pSVar5->_vptr_SENode)(pSVar5);
        if (iVar3 == 5) {
          operand_1 = ScalarEvolutionAnalysis::CreateConstant
                                (this->analysis_,(int64_t)coefficient_update);
          ScalarEvolutionAnalysis::CreateMultiplyNode(this->analysis_,operand_1,pSVar5);
        }
        else {
          iVar3 = (**pSVar5->_vptr_SENode)(pSVar5);
          if (iVar3 != 1) {
            __assert_fail("term->GetType() == SENode::RecurrentAddExpr && \"We only handle value unknowns or recurrent expressions\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis_simplification.cpp"
                          ,0x15e,"SENode *spvtools::opt::SENodeSimplifyImpl::SimplifyPolynomial()");
          }
          iVar3 = (*pSVar5->_vptr_SENode[6])(pSVar5);
          UpdateCoefficient(this,(SERecurrentNode *)CONCAT44(extraout_var,iVar3),
                            (int64_t)coefficient_update);
        }
      }
      goto LAB_0022c18a;
    }
  }
  ppSVar2 = ((new_node._M_head_impl)->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)((new_node._M_head_impl)->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3;
  if (lVar7 == 0) {
    pSVar5 = ScalarEvolutionAnalysis::CreateConstant(this->analysis_,0);
  }
  else {
    if (lVar7 != 1) {
      local_38._M_head_impl = new_node._M_head_impl;
      pSVar5 = ScalarEvolutionAnalysis::GetCachedOrAdd
                         (this->analysis_,
                          (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                           *)&local_38);
      if (local_38._M_head_impl == (SENode *)0x0) {
        return pSVar5;
      }
      pp_Var6 = (local_38._M_head_impl)->_vptr_SENode;
      new_node._M_head_impl = local_38._M_head_impl;
      goto LAB_0022c1f6;
    }
    pSVar5 = *ppSVar2;
  }
  pp_Var6 = (new_node._M_head_impl)->_vptr_SENode;
LAB_0022c1f6:
  (*pp_Var6[2])(new_node._M_head_impl);
  return pSVar5;
}

Assistant:

SENode* SENodeSimplifyImpl::SimplifyPolynomial() {
  std::unique_ptr<SENode> new_add{new SEAddNode(node_->GetParentAnalysis())};

  // Traverse the graph and gather the accumulators from it.
  GatherAccumulatorsFromChildNodes(new_add.get(), node_, false);

  // Fold all the constants into a single constant node.
  if (constant_accumulator_ != 0) {
    new_add->AddChild(analysis_.CreateConstant(constant_accumulator_));
  }

  for (auto& pair : accumulators_) {
    SENode* term = pair.first;
    int64_t count = pair.second;

    // We can eliminate the term completely.
    if (count == 0) continue;

    if (count == 1) {
      new_add->AddChild(term);
    } else if (count == -1 && term->GetType() != SENode::RecurrentAddExpr) {
      // If the count is -1 we can just add a negative version of that node,
      // unless it is a recurrent expression as we would rather the negative
      // goes on the recurrent expressions children. This makes it easier to
      // work with in other places.
      new_add->AddChild(analysis_.CreateNegation(term));
    } else {
      // Output value unknown terms as count*term and output recurrent
      // expression terms as rec(offset, coefficient + count) offset and
      // coefficient are the same as in the original expression.
      if (term->GetType() == SENode::ValueUnknown) {
        SENode* count_as_constant = analysis_.CreateConstant(count);
        new_add->AddChild(
            analysis_.CreateMultiplyNode(count_as_constant, term));
      } else {
        assert(term->GetType() == SENode::RecurrentAddExpr &&
               "We only handle value unknowns or recurrent expressions");

        // Create a new recurrent expression by adding the count to the
        // coefficient of the old one.
        new_add->AddChild(UpdateCoefficient(term->AsSERecurrentNode(), count));
      }
    }
  }

  // If there is only one term in the addition left just return that term.
  if (new_add->GetChildren().size() == 1) {
    return new_add->GetChild(0);
  }

  // If there are no terms left in the addition just return 0.
  if (new_add->GetChildren().size() == 0) {
    return analysis_.CreateConstant(0);
  }

  return analysis_.GetCachedOrAdd(std::move(new_add));
}